

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1b8a13::CAPIExternalCommand::processDependencyInfoDiscoveredDependencies
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          string *depsPath)

{
  TaskInterface ti_00;
  bool bVar1;
  undefined8 uVar2;
  FileSystem *pFVar3;
  BuildSystemDelegate *pBVar4;
  size_t sVar5;
  pointer this_00;
  error_code eVar6;
  StringRef SVar7;
  DependencyInfoParser local_1230;
  char *local_1218;
  void *local_1208;
  void *local_1200;
  undefined1 local_11f8 [8];
  DepsActions actions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1190;
  undefined8 local_1170;
  StringRef local_1160;
  string local_1150;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_1130;
  int local_1128;
  error_category *local_1120;
  Twine local_1118;
  Twine local_1100;
  Twine local_10e8;
  Twine local_10d0;
  StringRef local_10b8;
  undefined1 local_10a8 [8];
  SmallString<4096U> absPath;
  Twine local_90;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_78;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> input;
  string *depsPath_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  CAPIExternalCommand *this_local;
  TaskInterface ti_local;
  
  input._M_t.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
       (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
       depsPath;
  std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>::
  unique_ptr<std::default_delete<llvm::MemoryBuffer>,void>
            ((unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>> *)&local_78);
  llvm::Twine::Twine(&local_90,depsPath);
  bVar1 = llvm::sys::path::is_absolute(&local_90,native);
  if (bVar1) {
    pFVar3 = llbuild::buildsystem::BuildSystem::getFileSystem(system);
    (*pFVar3->_vptr_FileSystem[4])
              (absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
               InlineElts + 0xff8,pFVar3,depsPath);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::operator=
              (&local_78,
               (unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
               (absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                InlineElts + 0xff8));
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
              ((unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
               (absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                InlineElts + 0xff8));
  }
  else {
    uVar2 = std::__cxx11::string::data();
    local_10b8.Data = (char *)uVar2;
    uVar2 = std::__cxx11::string::length();
    local_10b8.Length = uVar2;
    llvm::SmallString<4096U>::SmallString((SmallString<4096U> *)local_10a8,local_10b8);
    llvm::Twine::Twine(&local_10d0,depsPath);
    llvm::Twine::Twine(&local_10e8,"");
    llvm::Twine::Twine(&local_1100,"");
    llvm::Twine::Twine(&local_1118,"");
    llvm::sys::path::append
              ((SmallVectorImpl<char> *)local_10a8,&local_10d0,&local_10e8,&local_1100,&local_1118);
    eVar6 = llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)local_10a8);
    local_1120 = eVar6._M_cat;
    local_1128 = eVar6._M_value;
    pFVar3 = llbuild::buildsystem::BuildSystem::getFileSystem(system);
    local_1160 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_10a8);
    llvm::StringRef::operator_cast_to_string(&local_1150,&local_1160);
    (*pFVar3->_vptr_FileSystem[4])(&local_1130,pFVar3,&local_1150);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::operator=
              (&local_78,&local_1130);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
              (&local_1130);
    std::__cxx11::string::~string((string *)&local_1150);
    llvm::SmallString<4096U>::~SmallString((SmallString<4096U> *)local_10a8);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_78);
  if (bVar1) {
    local_1208 = ti.impl;
    local_1200 = ti.ctx;
    local_1218 = (char *)std::__cxx11::string::data();
    sVar5 = std::__cxx11::string::length();
    ti_00.ctx = local_1200;
    ti_00.impl = local_1208;
    SVar7.Length = sVar5;
    SVar7.Data = local_1218;
    (anonymous_namespace)::CAPIExternalCommand::processDependencyInfoDiscoveredDependencies(llbuild
    ::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,std::
    __cxx11::string)::DepsActions::DepsActions(llbuild::buildsystem::BuildSystem&,llbuild::core::
    TaskInterface,(anonymous_namespace)::CAPIExternalCommand*,llvm::StringRef_
              (local_11f8,system,ti_00,this,SVar7);
    this_00 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
              operator->(&local_78);
    SVar7 = llvm::MemoryBuffer::getBuffer(this_00);
    llbuild::core::DependencyInfoParser::DependencyInfoParser
              (&local_1230,SVar7,(ParseActions *)local_11f8);
    llbuild::core::DependencyInfoParser::parse(&local_1230);
    ti_local.ctx._7_1_ = (int)actions.depsPath.Length == 0;
    actions._60_4_ = 1;
    processDependencyInfoDiscoveredDependencies::DepsActions::~DepsActions
              ((DepsActions *)local_11f8);
  }
  else {
    pBVar4 = llbuild::buildsystem::BuildSystem::getDelegate(system);
    std::operator+(&local_11b0,"unable to open dependencies file (",depsPath);
    std::operator+(&local_1190,&local_11b0,")");
    local_1170 = std::__cxx11::string::data();
    uVar2 = std::__cxx11::string::length();
    (*pBVar4->_vptr_BuildSystemDelegate[0xb])(pBVar4,this,local_1170,uVar2);
    std::__cxx11::string::~string((string *)&local_1190);
    std::__cxx11::string::~string((string *)&local_11b0);
    ti_local.ctx._7_1_ = false;
    actions._60_4_ = 1;
  }
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
            (&local_78);
  return ti_local.ctx._7_1_;
}

Assistant:

bool processDependencyInfoDiscoveredDependencies(BuildSystem& system,
                                                   core::TaskInterface ti,
                                                   QueueJobContext* context,
                                                   std::string depsPath) {
    // Read the dependencies file.
    std::unique_ptr<llvm::MemoryBuffer> input;
    if (llvm::sys::path::is_absolute(depsPath)) {
      input = system.getFileSystem().getFileContents(depsPath);
    } else {
      SmallString<PATH_MAX> absPath = StringRef(workingDirectory);
      llvm::sys::path::append(absPath, depsPath);
      llvm::sys::fs::make_absolute(absPath);
      input = system.getFileSystem().getFileContents(StringRef(absPath));
    }
    if (!input) {
      system.getDelegate().commandHadError(this, "unable to open dependencies file (" + depsPath + ")");
      return false;
    }
    
    // Parse the output.
    //
    // We just ignore the rule, and add any dependency that we encounter in the
    // file.
    struct DepsActions : public core::DependencyInfoParser::ParseActions {
      BuildSystem& system;
      core::TaskInterface ti;
      CAPIExternalCommand* command;
      StringRef depsPath;
      unsigned numErrors{0};
      
      DepsActions(BuildSystem& system,
                  core::TaskInterface ti,
                  CAPIExternalCommand* command, StringRef depsPath)
      : system(system), ti(ti), command(command), depsPath(depsPath) {}
      
      virtual void error(const char* message, uint64_t position) override {
        system.getDelegate().commandHadError(command, "error reading dependency file '" + depsPath.str() + "': " + std::string(message));
        ++numErrors;
      }
      
      // Ignore everything but actual inputs.
      virtual void actOnVersion(StringRef) override { }
      virtual void actOnMissing(StringRef path) override {
        system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Missing);
      }
      virtual void actOnOutput(StringRef path) override {
        system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Output);
      }
      virtual void actOnInput(StringRef path) override {
        ti.discoveredDependency(BuildKey::makeNode(path).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Input);
      }
    };
    
    DepsActions actions(system, ti, this, depsPath);
    core::DependencyInfoParser(input->getBuffer(), actions).parse();
    return actions.numErrors == 0;
  }